

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O1

void cppwinrt::write_produce_upcall
               (writer *w,string_view *upcall,method_signature *method_signature)

{
  pointer ppVar1;
  table_base *this;
  database *this_00;
  bool bVar2;
  unsigned_short uVar3;
  uint index;
  type *param;
  pointer ppVar4;
  string_view name;
  string_view local_58;
  string_view local_48;
  anon_class_8_1_89897ddb_conflict1 local_38;
  
  if (*(bool *)((long)&(method_signature->m_signature).m_ret_type.m_type.
                       super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
                       super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
                       super__Optional_payload_base<winmd::reader::TypeSig> + 0x88) == true) {
    local_58 = cppwinrt::method_signature::return_param_name(method_signature);
    local_38.args = method_signature;
    if ((method_signature->m_signature).m_ret_type.m_type.
        super__Optional_base<winmd::reader::TypeSig,_false,_false>._M_payload.
        super__Optional_payload<winmd::reader::TypeSig,_true,_false,_false>.
        super__Optional_payload_base<winmd::reader::TypeSig>._M_payload._M_value.m_is_szarray ==
        true) {
      local_48._M_len = 0x2a;
      local_48._M_str = "std::tie(*__%Size, *%) = detach_abi(%(%));";
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,&local_48,&local_58,&local_58,upcall,
                 &local_38);
    }
    else {
      local_48._M_len = 0x1a;
      local_48._M_str = "*% = detach_from<%>(%(%));";
      writer_base<cppwinrt::writer>::
      write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                (&w->super_writer_base<cppwinrt::writer>,&local_48,&local_58,
                 &(method_signature->m_signature).m_ret_type,upcall,&local_38);
    }
  }
  else {
    local_58._M_str = "%(%);";
    local_58._M_len = 5;
    local_48._M_len = (size_t)method_signature;
    writer_base<cppwinrt::writer>::
    write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
              (&w->super_writer_base<cppwinrt::writer>,&local_58,upcall,
               (anon_class_8_1_89897ddb_conflict1 *)&local_48);
  }
  ppVar4 = (method_signature->m_params).
           super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (method_signature->m_params).
           super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    do {
      uVar3 = winmd::reader::table_base::get_value<unsigned_short>
                        ((ppVar4->first).super_row_base<winmd::reader::Param>.m_table,
                         (ppVar4->first).super_row_base<winmd::reader::Param>.m_index,0);
      if (((uVar3 & 2) != 0) && ((ppVar4->second->m_type).m_is_szarray == false)) {
        bVar2 = is_object(&ppVar4->second->m_type);
        if (bVar2) {
          this = (ppVar4->first).super_row_base<winmd::reader::Param>.m_table;
          this_00 = this->m_database;
          index = winmd::reader::table_base::get_value<unsigned_int>
                            (this,(ppVar4->first).super_row_base<winmd::reader::Param>.m_index,2);
          local_58 = winmd::reader::database::get_string(this_00,index);
          local_48._M_len = 0x36;
          local_48._M_str = "\n                if (%) *% = detach_abi(winrt_impl_%);";
          writer_base<cppwinrt::writer>::
          write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (&w->super_writer_base<cppwinrt::writer>,&local_48,&local_58,&local_58,&local_58
                    );
        }
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  return;
}

Assistant:

static void write_produce_upcall(writer& w, std::string_view const& upcall, method_signature const& method_signature)
    {
        if (method_signature.return_signature())
        {
            auto name = method_signature.return_param_name();

            if (method_signature.return_signature().Type().is_szarray())
            {
                w.write("std::tie(*__%Size, *%) = detach_abi(%(%));",
                    name,
                    name,
                    upcall,
                    bind<write_produce_args>(method_signature));
            }
            else
            {
                w.write("*% = detach_from<%>(%(%));",
                    name,
                    method_signature.return_signature(),
                    upcall,
                    bind<write_produce_args>(method_signature));
            }
        }
        else
        {
            w.write("%(%);",
                upcall,
                bind<write_produce_args>(method_signature));
        }

        for (auto&& [param, param_signature] : method_signature.params())
        {
            if (param.Flags().Out() && !param_signature->Type().is_szarray() && is_object(param_signature->Type()))
            {
                auto param_name = param.Name();

                w.write("\n                if (%) *% = detach_abi(winrt_impl_%);", param_name, param_name, param_name);
            }
        }
    }